

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O1

string_t duckdb::UncompressedStringStorage::ReadString
                   (data_ptr_t target,int32_t offset,uint32_t string_length)

{
  anon_union_16_2_67f50693_for_value aVar1;
  data_ptr_t pdVar2;
  data_ptr_t __src;
  undefined4 uStack_c;
  undefined4 uStack_8;
  undefined4 uStack_4;
  
  __src = target + offset;
  if (string_length < 0xd) {
    uStack_4 = 0;
    uStack_c = 0;
    uStack_8 = 0;
    pdVar2 = (data_ptr_t)0x0;
    if (string_length != 0) {
      switchD_00b1422a::default(&uStack_c,__src,(ulong)string_length);
      pdVar2 = (data_ptr_t)CONCAT44(uStack_4,uStack_8);
    }
  }
  else {
    uStack_c = *(undefined4 *)__src;
    pdVar2 = __src;
  }
  uStack_4 = (undefined4)((ulong)pdVar2 >> 0x20);
  uStack_8 = SUB84(pdVar2,0);
  aVar1._4_1_ = (undefined1)uStack_c;
  aVar1._5_1_ = uStack_c._1_1_;
  aVar1._6_1_ = uStack_c._2_1_;
  aVar1._7_1_ = uStack_c._3_1_;
  aVar1.pointer.length = string_length;
  aVar1._8_4_ = uStack_8;
  aVar1._12_4_ = uStack_4;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t UncompressedStringStorage::ReadString(data_ptr_t target, int32_t offset, uint32_t string_length) {
	auto ptr = target + offset;
	auto str_ptr = char_ptr_cast(ptr);
	return string_t(str_ptr, string_length);
}